

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O3

bool anon_unknown.dwarf_5f52c::isNullableAndMutable(Expression *ref,Index fieldIndex)

{
  ulong *puVar1;
  int iVar2;
  long *plVar3;
  ulong local_38;
  undefined8 uStack_30;
  int iStack_2c;
  Type local_20;
  uintptr_t local_18;
  
  local_20.id = (uintptr_t)ref;
  if (((Expression *)0x6 < ref) && (((ulong)ref & 1) == 0)) {
    local_18 = (uintptr_t)wasm::Type::getHeapType(&local_20);
    iVar2 = wasm::HeapType::getKind();
    if (iVar2 == 3) {
      wasm::HeapType::getArray();
    }
    else {
      if (iVar2 != 2) goto LAB_0014614f;
      plVar3 = (long *)wasm::HeapType::getStruct();
      puVar1 = (ulong *)(*plVar3 + (ulong)fieldIndex * 0x10);
      local_38 = *puVar1;
      iStack_2c = (int)(puVar1[1] >> 0x20);
    }
    return (((uint)local_38 & 3) == 2 && 6 < local_38) && iStack_2c == 1;
  }
LAB_0014614f:
  __assert_fail("field",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-ctor-eval.cpp"
                ,0x3e,"bool (anonymous namespace)::isNullableAndMutable(Expression *, Index)");
}

Assistant:

bool isNullableAndMutable(Expression* ref, Index fieldIndex) {
  // Find the field for the given reference, and check its properties.
  auto field = GCTypeUtils::getField(ref->type, fieldIndex);
  assert(field);
  return field->type.isNullable() && field->mutable_ == Mutable;
}